

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall
addrman_tests::addrman_select_by_network::test_method(addrman_select_by_network *this)

{
  CService ipIn;
  __single_object _Var1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> time;
  uint uVar5;
  byte bVar6;
  iterator in_R8;
  iterator pvVar7;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *puVar8;
  CAddress *pCVar9;
  iterator in_R9;
  iterator pvVar10;
  CAddress *pCVar11;
  byte bVar12;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_00;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  initializer_list<CAddress> __l_01;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  undefined4 uVar13;
  undefined4 uVar14;
  check_type cVar15;
  undefined8 in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff840;
  undefined8 in_stack_fffffffffffff848;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 local_729;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 local_691;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 local_599;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_without_entries;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_with_entries;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  __single_object addrman;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_200;
  undefined4 local_1c4;
  undefined8 local_1c0;
  char *local_1b8;
  direct_or_indirect local_1b0;
  shared_count sStack_1a0;
  CAddress selected;
  CAddress i2p_addr2;
  CService local_120;
  CService addr1;
  CNetAddr source;
  CAddress i2p_addr;
  direct_or_indirect local_78;
  undefined1 *local_68 [2];
  uint16_t local_58;
  NodeSeconds local_50;
  ServiceFlags SStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xc7;
  file.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&addr1,(int)&source);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( true, {NET_IPV4}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( true, {NET_IPV4}).first.IsValid()" + 0x33;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_230 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_238,199);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0xc8;
  file_00.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&addr1,(int)&source);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( false, {NET_IPV4}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( false, {NET_IPV4}).first.IsValid()" + 0x34;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_260 = "";
  uVar13 = 0;
  uVar14 = 0;
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_268,200);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"252.2.2.2",(allocator<char> *)&i2p_addr);
  ResolveIP(&source,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"250.1.1.1",(allocator<char> *)&i2p_addr);
  ResolveService(&addr1,(string *)&local_78,0x208d);
  std::__cxx11::string::~string((string *)&local_78);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0xcd;
  file_01.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  _Var1 = addrman;
  CService::CService(&local_120,&addr1);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar14;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar13;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar15;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff838;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff840;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff840 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff848;
  CAddress::CAddress((CAddress *)&local_78,ipIn,(ServiceFlags)&local_120);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&nets_without_entries,__l,
             (allocator_type *)&selected);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&nets_without_entries,&source,
                       (seconds)0x0);
  nets_with_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_with_entries._M_h._M_buckets._1_7_,bVar3);
  nets_with_entries._M_h._M_bucket_count = 0;
  nets_with_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  i2p_addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  i2p_addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_290 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  i2p_addr.super_CService.super_CNetAddr._24_8_ = &i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_with_entries,(lazy_ostream *)&i2p_addr,1,0,WARN,_cVar15,
             (size_t)&local_298,0xcd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_with_entries._M_h._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&nets_without_entries);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0xcf;
  file_02.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  uVar13 = SUB84(&local_1c0,0);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = ::operator==((CService *)&local_78,&addr1);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( true, {NET_IPV4}).first == addr1";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( true, {NET_IPV4}).first == addr1" + 0x31;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_2c8,0xcf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0xd0;
  file_03.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
             msg_03);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = ::operator==((CService *)&local_78,&addr1);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false, {NET_IPV4}).first == addr1";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( false, {NET_IPV4}).first == addr1" + 0x32;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_2f8,0xd0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0xd1;
  file_04.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
             msg_04);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 2;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( false, {NET_IPV6}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( false, {NET_IPV6}).first.IsValid()" + 0x34;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_320 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_328,0xd1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0xd2;
  file_05.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_348,
             msg_05);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 3;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( false, {NET_ONION}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( false, {NET_ONION}).first.IsValid()" + 0x35;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_350 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_358,0xd2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0xd3;
  file_06.m_begin = (iterator)&local_368;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_378,
             msg_06);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( false, {NET_I2P}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( false, {NET_I2P}).first.IsValid()" + 0x33;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_380 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_388,0xd3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0xd4;
  file_07.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3a8,
             msg_07);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( false, {NET_CJDNS}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( false, {NET_CJDNS}).first.IsValid()" + 0x35;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_3b8,0xd4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0xd5;
  file_08.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d8,
             msg_08);
  _Var1 = addrman;
  selected.super_CService.super_CNetAddr.m_addr._union._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr,&selected,
             (undefined1 *)((long)&selected.super_CService.super_CNetAddr.m_addr._union + 4),0,
             &local_200,&local_1b0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,!bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "!addrman->Select( true, {NET_CJDNS}).first.IsValid()";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"!addrman->Select( true, {NET_CJDNS}).first.IsValid()" + 0x34;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_3e8,0xd5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar7;
  file_09.m_end = (iterator)0xd6;
  file_09.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_408,
             msg_09);
  i2p_addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&i2p_addr.nServices;
  i2p_addr.super_CService.super_CNetAddr.m_addr._union._8_8_ = 1;
  i2p_addr.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  i2p_addr.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  i2p_addr.super_CService.super_CNetAddr.m_scope_id = 0;
  i2p_addr.super_CService.port = 0;
  i2p_addr.super_CService._34_6_ = 0x3f80;
  i2p_addr.nTime.__d.__r = (duration)0;
  i2p_addr.nServices = NODE_NONE;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr);
  bVar3 = ::operator==((CService *)&local_78,&addr1);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false).first == addr1";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( false).first == addr1" + 0x26;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&i2p_addr2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_418,0xd6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr);
  CAddress::CAddress(&i2p_addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.i2p",
             (allocator<char> *)&nets_with_entries);
  CNetAddr::SetSpecial((CNetAddr *)&i2p_addr,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar7;
  file_10.m_end = (iterator)0xdb;
  file_10.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  _Var1 = addrman;
  CAddress::CAddress((CAddress *)&local_78,&i2p_addr);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr2,__l_00,
             (allocator_type *)&local_200);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr2,&source,
                       (seconds)0x0);
  nets_without_entries._M_h._M_buckets =
       (__buckets_ptr)CONCAT71(nets_without_entries._M_h._M_buckets._1_7_,bVar3);
  nets_without_entries._M_h._M_bucket_count = 0;
  nets_without_entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({i2p_addr}, source)";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({i2p_addr}, source)" + 0x20;
  nets_with_entries._M_h._M_bucket_count =
       nets_with_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_with_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_with_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_with_entries._M_h._M_element_count = (size_type)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&nets_without_entries,(lazy_ostream *)&nets_with_entries,1,0,WARN,
             _cVar15,(size_t)&local_448,0xdb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&nets_without_entries._M_h._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar7;
  file_11.m_end = (iterator)0xdd;
  file_11.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_468,
             msg_11);
  _Var1 = addrman;
  local_200._M_buckets._0_4_ = 4;
  uVar13 = SUB84(&local_1c4,0);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_with_entries,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,
             &local_1b0,&local_1c0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,&nets_with_entries);
  bVar3 = ::operator==((CAddress *)&local_78,&i2p_addr);
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( true, {NET_I2P}).first == i2p_addr";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( true, {NET_I2P}).first == i2p_addr" + 0x33;
  nets_without_entries._M_h._M_bucket_count =
       nets_without_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_without_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_without_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_without_entries._M_h._M_element_count = (size_type)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr2,(lazy_ostream *)&nets_without_entries,1,0,WARN,_cVar15,
             (size_t)&local_4b0,0xdd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&i2p_addr2.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_with_entries._M_h);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar7;
  file_12.m_end = (iterator)0xde;
  file_12.m_begin = (iterator)&local_4c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4d0,
             msg_12);
  _Var1 = addrman;
  local_200._M_buckets._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_with_entries,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,
             &local_1b0,&local_1c0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_with_entries);
  bVar3 = ::operator==((CAddress *)&local_78,&i2p_addr);
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false, {NET_I2P}).first == i2p_addr";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( false, {NET_I2P}).first == i2p_addr" + 0x34;
  nets_without_entries._M_h._M_bucket_count =
       nets_without_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_without_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_without_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_without_entries._M_h._M_element_count = (size_type)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr2,(lazy_ostream *)&nets_without_entries,1,0,WARN,_cVar15,
             (size_t)&local_4e0,0xde);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&i2p_addr2.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_with_entries._M_h);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar7;
  file_13.m_end = (iterator)0xdf;
  file_13.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_500,
             msg_13);
  _Var1 = addrman;
  local_200._M_buckets = (__buckets_ptr)CONCAT44(local_200._M_buckets._4_4_,1);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_with_entries,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,
             &local_1b0,&local_1c0,uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_with_entries);
  bVar3 = ::operator==((CService *)&local_78,&addr1);
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false, {NET_IPV4}).first == addr1";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( false, {NET_IPV4}).first == addr1" + 0x32;
  nets_without_entries._M_h._M_bucket_count =
       nets_without_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_without_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_without_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_508 = "";
  nets_without_entries._M_h._M_element_count = (size_type)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr2,(lazy_ostream *)&nets_without_entries,1,0,WARN,_cVar15,
             (size_t)&local_510,0xdf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&i2p_addr2.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_with_entries._M_h);
  local_78.indirect_contents.indirect = (char *)0x400000001;
  puVar8 = &nets_without_entries;
  pCVar9 = &i2p_addr2;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_with_entries,&local_78,(long)&local_78 + 8,0,puVar8,pCVar9,(int)&selected);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pCVar9;
  msg_14.m_begin = (iterator)puVar8;
  file_14.m_end = (iterator)0xe1;
  file_14.m_begin = (iterator)&local_520;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_530,
             msg_14);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_with_entries);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Select( false, nets_with_entries).first.IsValid()";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Select( false, nets_with_entries).first.IsValid()" + 0x3a;
  nets_without_entries._M_h._M_bucket_count =
       nets_without_entries._M_h._M_bucket_count & 0xffffffffffffff00;
  nets_without_entries._M_h._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  nets_without_entries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_538 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  nets_without_entries._M_h._M_element_count = (size_type)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr2,(lazy_ostream *)&nets_without_entries,1,0,WARN,_cVar15,
             (size_t)&local_540,0xe1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&i2p_addr2.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar7;
  file_15.m_end = (iterator)0xe2;
  file_15.m_begin = (iterator)&local_550;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_560,
             msg_15);
  _Var1 = addrman;
  local_1b0._0_4_ = 2;
  uVar13 = SUB84(&local_599,0);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_without_entries,&local_1b0,(long)local_1b0.direct + 4,0,&local_1c0,&local_1c4,
             uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_without_entries);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = !bVar3;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f34f;
  local_200._M_bucket_count = 0xb4f383;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  i2p_addr2.super_CService.super_CNetAddr._24_8_ = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&i2p_addr2,1,0,WARN,_cVar15,
             (size_t)&local_5b0,0xe2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_without_entries._M_h);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar10;
  msg_16.m_begin = pvVar7;
  file_16.m_end = (iterator)0xe3;
  file_16.m_begin = (iterator)&local_5c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5d0,
             msg_16);
  _Var1 = addrman;
  local_1b0._0_4_ = 3;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_without_entries,&local_1b0,(long)local_1b0.direct + 4,0,&local_1c0,&local_1c4,
             uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_without_entries);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = !bVar3;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f384;
  local_200._M_bucket_count = 0xb4f3b9;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  i2p_addr2.super_CService.super_CNetAddr._24_8_ = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&i2p_addr2,1,0,WARN,_cVar15,
             (size_t)&local_5e0,0xe3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_without_entries._M_h);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar10;
  msg_17.m_begin = pvVar7;
  file_17.m_end = (iterator)0xe4;
  file_17.m_begin = (iterator)&local_5f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_600,
             msg_17);
  _Var1 = addrman;
  local_1b0._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_without_entries,&local_1b0,(long)local_1b0.direct + 4,0,&local_1c0,&local_1c4,
             uVar13);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_without_entries);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = !bVar3;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f3ee;
  local_200._M_bucket_count = 0xb4f423;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  i2p_addr2.super_CService.super_CNetAddr._24_8_ = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&i2p_addr2,1,0,WARN,_cVar15,
             (size_t)&local_610,0xe4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_without_entries._M_h);
  local_78.indirect_contents.indirect = (char *)0x300000002;
  local_78.indirect_contents.capacity = 5;
  pCVar9 = &i2p_addr2;
  pCVar11 = &selected;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&nets_without_entries,&local_78,(undefined1 *)((long)&local_78 + 0xc),0,pCVar9,
             pCVar11,(int)&local_200);
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = (iterator)pCVar11;
  msg_18.m_begin = (iterator)pCVar9;
  file_18.m_end = (iterator)0xe6;
  file_18.m_begin = (iterator)&local_620;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_630,
             msg_18);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,&nets_without_entries);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = !bVar3;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f55b;
  local_200._M_bucket_count = 0xb4f599;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  i2p_addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_638 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  i2p_addr2.super_CService.super_CNetAddr._24_8_ = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&i2p_addr2,1,0,WARN,_cVar15,
             (size_t)&local_640,0xe6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar10;
  msg_19.m_begin = pvVar7;
  file_19.m_end = (iterator)0xe9;
  file_19.m_begin = (iterator)&local_650;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_660,
             msg_19);
  _Var1 = addrman;
  time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar3 = AddrMan::Good((AddrMan *)
                        _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                        &i2p_addr.super_CService,(NodeSeconds)time.__d.__r);
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._size = 0;
  i2p_addr2.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Good(i2p_addr)";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Good(i2p_addr)" + 0x17;
  local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_68[0] = boost::unit_test::lazy_ostream::inst;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_668 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_68[1] = (undefined1 *)&selected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr2,(lazy_ostream *)&local_78,1,0,WARN,_cVar15,
             (size_t)&local_670,0xe9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&i2p_addr2.super_CService.super_CNetAddr.m_addr._size);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar7;
  file_20.m_end = (iterator)0xeb;
  file_20.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_690,
             msg_20);
  _Var1 = addrman;
  local_1c0._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr2,&local_1c0,(long)&local_1c0 + 4,0,&local_1c4,&local_599,(int)&local_691);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr2);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0.indirect_contents.indirect = "!addrman->Select( true, {NET_I2P}).first.IsValid()";
  local_1b0._8_8_ = (long)"!addrman->Select( true, {NET_I2P}).first.IsValid()" + 0x32;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       selected.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  selected.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  selected.super_CService.super_CNetAddr._24_8_ = &local_1b0;
  local_200._M_buckets._0_1_ = !bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&selected,1,0,WARN,_cVar15,
             (size_t)&local_6a8,0xeb);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr2);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar10;
  msg_21.m_begin = pvVar7;
  file_21.m_end = (iterator)0xec;
  file_21.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6c8,
             msg_21);
  _Var1 = addrman;
  local_1c0 = (char *)CONCAT44(local_1c0._4_4_,4);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&i2p_addr2,&local_1c0,(long)&local_1c0 + 4,0,&local_1c4,&local_599,(int)&local_691);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&i2p_addr2);
  local_200._M_buckets._0_1_ = ::operator==((CAddress *)&local_78,&i2p_addr);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0.indirect_contents.indirect = "addrman->Select( false, {NET_I2P}).first == i2p_addr";
  local_1b0._8_8_ = (long)"addrman->Select( false, {NET_I2P}).first == i2p_addr" + 0x34;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       selected.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  selected.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d0 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  selected.super_CService.super_CNetAddr._24_8_ = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&selected,1,0,WARN,_cVar15,
             (size_t)&local_6d8,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&i2p_addr2);
  CAddress::CAddress(&i2p_addr2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"c4gfnttsuwqomiygupdqqqyy5y5emnk5c73hrfvatri67prd7vyq.b32.i2p",
             (allocator<char> *)&selected);
  CNetAddr::SetSpecial((CNetAddr *)&i2p_addr2,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar7;
  file_22.m_end = (iterator)0xf1;
  file_22.m_begin = (iterator)&local_6e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_6f8,
             msg_22);
  _Var1 = addrman;
  CAddress::CAddress((CAddress *)&local_78,&i2p_addr2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1b0,__l_01,
             (allocator_type *)&local_1c4);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_1b0,&source,
                       (seconds)0x0);
  local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,bVar3);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c0 = "addrman->Add({i2p_addr2}, source)";
  local_1b8 = "";
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       selected.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  selected.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_700 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  selected.super_CService.super_CNetAddr._24_8_ = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&selected,1,0,WARN,_cVar15,
             (size_t)&local_708,0xf1);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1b0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar10;
  msg_23.m_begin = pvVar7;
  file_23.m_end = (iterator)0xf3;
  file_23.m_begin = (iterator)&local_718;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_728,
             msg_23);
  _Var1 = addrman;
  local_1c4 = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&selected,&local_1c4,&local_1c0,0,&local_599,&local_691,(int)&local_729);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,
                  (AddrMan *)
                  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&selected);
  bVar3 = ::operator==((CAddress *)&local_78,&i2p_addr2);
  local_1b0.direct[0] = bVar3;
  local_1b0._8_8_ = (element_type *)0x0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c0 = "addrman->Select( true, {NET_I2P}).first == i2p_addr2";
  local_1b8 = "";
  local_200._M_bucket_count = local_200._M_bucket_count & 0xffffffffffffff00;
  local_200._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_0113a070;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_738 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_200._M_element_count = (size_type)&local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1b0,(lazy_ostream *)&local_200,1,0,WARN,_cVar15,
             (size_t)&local_740,0xf3);
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&selected);
  uVar5 = 0x100;
  bVar12 = 0;
  bVar6 = 0;
  while ((_Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
          super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
               addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl, 1 < uVar5 &&
         ((bVar12 & bVar6) == 0))) {
    local_1b0._0_4_ = 4;
    pvVar7 = (iterator)&local_1c0;
    pvVar10 = (iterator)&local_1c4;
    std::
    _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<Network_const*>
              ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_200,&local_1b0,(long)local_1b0.direct + 4,0,pvVar7,pvVar10,(int)&local_599)
    ;
    AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_78,
                    (AddrMan *)
                    _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&local_200);
    selected.super_CService.super_CNetAddr.m_addr._union._8_8_ =
         CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity);
    uVar13 = local_68[0]._0_4_;
    local_68[0] = (undefined1 *)((ulong)local_68[0] & 0xffffffff00000000);
    selected.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         local_78.indirect_contents.indirect;
    selected.super_CService.super_CNetAddr.m_addr._size = uVar13;
    selected.super_CService.super_CNetAddr._24_8_ = local_68[1];
    selected.super_CService.port = local_58;
    selected.nTime.__d.__r = (duration)(duration)local_50;
    selected.nServices = SStack_48;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78);
    std::
    _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_200);
    local_750 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_748 = "";
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_24.m_end = pvVar10;
    msg_24.m_begin = pvVar7;
    file_24.m_end = (iterator)0xfc;
    file_24.m_begin = (iterator)&local_750;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_760,
               msg_24);
    bVar3 = ::operator==(&selected,&i2p_addr);
    bVar4 = true;
    if (!bVar3) {
      bVar4 = ::operator==(&selected,&i2p_addr2);
    }
    local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,bVar4);
    local_200._M_bucket_count = 0;
    local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b0.indirect_contents.indirect = "selected == i2p_addr || selected == i2p_addr2";
    local_1b0._8_8_ = (long)"selected == i2p_addr || selected == i2p_addr2" + 0x2d;
    local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
    local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
    local_68[0] = boost::unit_test::lazy_ostream::inst;
    local_68[1] = (undefined1 *)&local_1b0;
    local_770 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_768 = "";
    pvVar7 = (iterator)0x2;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_200,(lazy_ostream *)&local_78,2,0,WARN,_cVar15,
               (size_t)&local_770,0xfc);
    boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
    bVar3 = ::operator==(&selected,&i2p_addr);
    bVar2 = 1;
    if (bVar3) {
      bVar6 = 1;
      bVar2 = bVar12;
    }
    bVar12 = bVar2;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&selected);
    uVar5 = uVar5 - 1;
  }
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar10;
  msg_25.m_begin = pvVar7;
  file_25.m_end = (iterator)0x104;
  file_25.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_790,
             msg_25);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar12;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f6a7;
  local_200._M_bucket_count = 0xb4f6b3;
  local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_68[0] = boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_798 = "";
  pvVar7 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  local_68[1] = (undefined1 *)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&local_78,1,0,WARN,_cVar15,
             (size_t)&local_7a0,0x104);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7a8 = "";
  msg_26.m_end = pvVar10;
  msg_26.m_begin = pvVar7;
  file_26.m_end = (iterator)0x105;
  file_26.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
             (size_t)&stack0xfffffffffffff840,msg_26);
  selected.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar6;
  selected.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  selected.super_CService.super_CNetAddr.m_addr._size = 0;
  selected.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_200._M_buckets = (__buckets_ptr)0xb4f6b4;
  local_200._M_bucket_count = 0xb4f6c2;
  local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_68[0] = boost::unit_test::lazy_ostream::inst;
  local_68[1] = (undefined1 *)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&selected,(lazy_ostream *)&local_78,1,0,WARN,0xb4ec59,
             (size_t)&stack0xfffffffffffff830,0x105);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&selected.super_CService.super_CNetAddr.m_addr._size);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&i2p_addr2);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_without_entries._M_h);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&nets_with_entries._M_h);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&i2p_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select_by_network)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_IPV4}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV4}).first.IsValid());

    // add ipv4 address to the new table
    CNetAddr source = ResolveIP("252.2.2.2");
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_IPV4}).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_I2P}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // add I2P address to the new table
    CAddress i2p_addr;
    i2p_addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    std::unordered_set<Network> nets_with_entries = {NET_IPV4, NET_I2P};
    BOOST_CHECK(addrman->Select(/*new_only=*/false, nets_with_entries).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    std::unordered_set<Network> nets_without_entries = {NET_IPV6, NET_ONION, NET_CJDNS};
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, nets_without_entries).first.IsValid());

    // bump I2P address to tried table
    BOOST_CHECK(addrman->Good(i2p_addr));

    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_I2P}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);

    // add another I2P address to the new table
    CAddress i2p_addr2;
    i2p_addr2.SetSpecial("c4gfnttsuwqomiygupdqqqyy5y5emnk5c73hrfvatri67prd7vyq.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr2}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr2);

    // ensure that both new and tried table are selected from
    bool new_selected{false};
    bool tried_selected{false};
    int counter = 256;

    while (--counter > 0 && (!new_selected || !tried_selected)) {
        const CAddress selected{addrman->Select(/*new_only=*/false, {NET_I2P}).first};
        BOOST_REQUIRE(selected == i2p_addr || selected == i2p_addr2);
        if (selected == i2p_addr) {
            tried_selected = true;
        } else {
            new_selected = true;
        }
    }

    BOOST_CHECK(new_selected);
    BOOST_CHECK(tried_selected);
}